

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.h
# Opt level: O1

void __thiscall
oout::dirty::Test::Test<std::shared_ptr<oout::NamedTest>,std::shared_ptr<oout::NamedTest>>
          (Test *this,string *name,shared_ptr<oout::NamedTest> *tests,
          shared_ptr<oout::NamedTest> *tests_1)

{
  undefined1 local_31;
  NamedTest *local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_28;
  shared_ptr<const_oout::Test> local_20;
  
  local_30 = (NamedTest *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::NamedTest,std::allocator<oout::NamedTest>,std::__cxx11::string_const&,std::shared_ptr<oout::NamedTest>const&,std::shared_ptr<oout::NamedTest>const&>
            (&_Stack_28,&local_30,(allocator<oout::NamedTest> *)&local_31,name,tests,tests_1);
  local_20.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_30->super_Test;
  local_20.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_28._M_pi;
  local_30 = (NamedTest *)0x0;
  _Stack_28._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Test(this,&local_20);
  if (local_20.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  if (_Stack_28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_28._M_pi);
  }
  return;
}

Assistant:

Test(
		const std::string &name,
		const T & ... tests
	) : Test(std::make_shared<oout::NamedTest>(name, tests...))
	{
	}